

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O3

void __thiscall QWidgetPrivate::enforceNativeChildren(QWidgetPrivate *this)

{
  QWidget *this_00;
  QWExtra *pQVar1;
  ulong uVar2;
  ulong uVar3;
  
  pQVar1 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar1 == (QWExtra *)0x0) {
    createExtra(this);
    pQVar1 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  }
  if ((*(ushort *)&pQVar1->field_0x7c & 0x20) == 0) {
    *(ushort *)&pQVar1->field_0x7c = *(ushort *)&pQVar1->field_0x7c | 0x20;
    uVar2 = *(ulong *)&this->field_0x28;
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        this_00 = *(QWidget **)(*(long *)&this->field_0x20 + uVar3 * 8);
        if ((this_00 != (QWidget *)0x0) &&
           ((*(byte *)(*(long *)&this_00->field_0x8 + 0x30) & 1) != 0)) {
          QWidget::setAttribute(this_00,WA_NativeWindow,true);
          uVar2 = *(ulong *)&this->field_0x28;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar2);
    }
  }
  return;
}

Assistant:

inline void enforceNativeChildren()
    {
        if (!extra)
            createExtra();

        if (extra->nativeChildrenForced)
            return;
        extra->nativeChildrenForced = 1;

        for (int i = 0; i < children.size(); ++i) {
            if (QWidget *child = qobject_cast<QWidget *>(children.at(i)))
                child->setAttribute(Qt::WA_NativeWindow);
        }
    }